

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void __thiscall
CPP::WriteInitialization::acceptTabStops(WriteInitialization *this,DomTabStops *tabStops)

{
  bool bVar1;
  Driver *this_00;
  qsizetype qVar2;
  const_reference s;
  char *pcVar3;
  QTextStream *pQVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  QString name;
  QStringList l;
  QString lastName;
  FILE *in_stack_ffffffffffffff28;
  QList<QString> *in_stack_ffffffffffffff30;
  QString *attributeName;
  int local_ac;
  QString local_80 [2];
  QString local_50;
  QList<QString> local_38;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QString::QString((QString *)0x13e9ba);
  local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  local_38.d.size = -0x5555555555555556;
  DomTabStops::elementTabStop((DomTabStops *)in_stack_ffffffffffffff28);
  local_ac = 0;
  while( true ) {
    this_00 = (Driver *)(long)local_ac;
    qVar2 = QList<QString>::size(&local_38);
    if (qVar2 <= (long)this_00) break;
    local_50.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_50.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_50.d.size = -0x5555555555555556;
    attributeName = (QString *)(in_RDI->d).size;
    QList<QString>::at(in_stack_ffffffffffffff30,(qsizetype)in_stack_ffffffffffffff28);
    Driver::widgetVariableName(this_00,attributeName);
    bVar1 = QString::isEmpty((QString *)0x13ea98);
    if (bVar1) {
      in_stack_ffffffffffffff28 = _stderr;
      Option::messagePrefix((Option *)this_00);
      QtPrivate::asString(local_80);
      QString::toLocal8Bit(in_RDI);
      in_stack_ffffffffffffff30 = (QList<QString> *)QByteArray::constData((QByteArray *)0x13eae3);
      s = QList<QString>::at(in_stack_ffffffffffffff30,(qsizetype)in_stack_ffffffffffffff28);
      QtPrivate::asString(s);
      QString::toLocal8Bit(in_RDI);
      pcVar3 = QByteArray::constData((QByteArray *)0x13eb19);
      fprintf(in_stack_ffffffffffffff28,
              "%s: Warning: Tab-stop assignment: \'%s\' is not a valid widget.\n",
              in_stack_ffffffffffffff30,pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x13eb3d);
      QByteArray::~QByteArray((QByteArray *)0x13eb47);
      QString::~QString((QString *)0x13eb51);
    }
    else if (local_ac == 0) {
      QString::operator=(&local_20,&local_50);
    }
    else {
      bVar1 = QString::isEmpty((QString *)0x13eb94);
      if ((!bVar1) && (bVar1 = QString::isEmpty((QString *)0x13eba5), !bVar1)) {
        pQVar4 = (QTextStream *)
                 QTextStream::operator<<((QTextStream *)in_RDI[1].d.d,(QString *)&in_RDI[1].d.size);
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"QWidget");
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)language::qualifier);
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"setTabOrder(");
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,&local_20);
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,", ");
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,&local_50);
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,')');
        QTextStream::operator<<(pQVar4,(QString *)language::eol);
        QString::operator=(&local_20,&local_50);
      }
    }
    QString::~QString((QString *)0x13ec6c);
    local_ac = local_ac + 1;
  }
  QList<QString>::~QList((QList<QString> *)0x13ec97);
  QString::~QString((QString *)0x13eca4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteInitialization::acceptTabStops(DomTabStops *tabStops)
{
    QString lastName;

    const QStringList l = tabStops->elementTabStop();
    for (int i=0; i<l.size(); ++i) {
        const QString name = m_driver->widgetVariableName(l.at(i));

        if (name.isEmpty()) {
            fprintf(stderr, "%s: Warning: Tab-stop assignment: '%s' is not a valid widget.\n",
                    qPrintable(m_option.messagePrefix()), qPrintable(l.at(i)));
            continue;
        }

        if (i == 0) {
            lastName = name;
            continue;
        }
        if (name.isEmpty() || lastName.isEmpty())
            continue;

        m_output << m_indent << "QWidget" << language::qualifier << "setTabOrder("
            << lastName << ", " << name << ')' << language::eol;

        lastName = name;
    }
}